

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void ClipperLib::MinkowskiSum(Path *pattern,Path *path,Paths *solution,bool pathIsClosed)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  Clipper c;
  undefined1 local_140 [136];
  ClipperBase local_b8;
  
  Minkowski(pattern,path,solution,true,pathIsClosed);
  local_b8.m_edges.super__Vector_base<ClipperLib::TEdge_*,_std::allocator<ClipperLib::TEdge_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.m_edges.super__Vector_base<ClipperLib::TEdge_*,_std::allocator<ClipperLib::TEdge_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.m_edges.super__Vector_base<ClipperLib::TEdge_*,_std::allocator<ClipperLib::TEdge_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.m_PolyOuts.
  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.m_PolyOuts.
  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.m_PolyOuts.
  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.m_Scanbeam.c.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.m_Scanbeam.c.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.m_Scanbeam.c.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.m_CurrentLM._M_current = (LocalMinimum *)0x0;
  local_b8.m_MinimaList.
  super__Vector_base<ClipperLib::LocalMinimum,_std::allocator<ClipperLib::LocalMinimum>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.m_MinimaList.
  super__Vector_base<ClipperLib::LocalMinimum,_std::allocator<ClipperLib::LocalMinimum>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.m_MinimaList.
  super__Vector_base<ClipperLib::LocalMinimum,_std::allocator<ClipperLib::LocalMinimum>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_140._0_8_ = &PTR_ExecuteInternal_00123c60;
  local_b8._vptr_ClipperBase = (_func_int **)&PTR__Clipper_00123ca8;
  p_Var1 = (_List_node_base *)(local_140 + 0x58);
  local_140._8_8_ = (pointer)0x0;
  local_140._16_8_ = (pointer)0x0;
  local_140._24_8_ = (pointer)0x0;
  local_140._32_8_ = (pointer)0x0;
  local_140._40_8_ = (pointer)0x0;
  local_140._48_8_ = (pointer)0x0;
  local_140._56_8_ = (pointer)0x0;
  local_140._64_8_ = (pointer)0x0;
  local_140._72_8_ = (pointer)0x0;
  local_140._104_8_ = 0;
  local_140[0x78] = false;
  local_b8.m_UseFullRange = false;
  local_140[0x84] = false;
  local_140[0x86] = false;
  local_b8.m_PreserveCollinear = false;
  local_b8.m_HasOpenPaths = false;
  local_140._88_8_ = p_Var1;
  local_140._96_8_ = p_Var1;
  ClipperBase::AddPaths(&local_b8,solution,ptSubject,true);
  Clipper::Execute((Clipper *)local_140,ctUnion,solution,pftNonZero,pftNonZero);
  local_140._0_8_ = &PTR_ExecuteInternal_00123c60;
  local_b8._vptr_ClipperBase = (_func_int **)&PTR__Clipper_00123ca8;
  p_Var3 = (_List_node_base *)local_140._88_8_;
  while (p_Var3 != p_Var1) {
    p_Var2 = p_Var3->_M_next;
    operator_delete(p_Var3,0x18);
    p_Var3 = p_Var2;
  }
  if ((pointer)local_140._56_8_ != (pointer)0x0) {
    operator_delete((void *)local_140._56_8_,local_140._72_8_ - local_140._56_8_);
  }
  if ((pointer)local_140._32_8_ != (pointer)0x0) {
    operator_delete((void *)local_140._32_8_,local_140._48_8_ - local_140._32_8_);
  }
  if ((pointer)local_140._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_140._8_8_,local_140._24_8_ - local_140._8_8_);
  }
  ClipperBase::~ClipperBase(&local_b8);
  return;
}

Assistant:

void MinkowskiSum(const Path& pattern, const Path& path, Paths& solution, bool pathIsClosed)
{
  Minkowski(pattern, path, solution, true, pathIsClosed);
  Clipper c;
  c.AddPaths(solution, ptSubject, true);
  c.Execute(ctUnion, solution, pftNonZero, pftNonZero);
}